

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void __thiscall Memory::Recycler::ClearTrackAllocInfo(Recycler *this,TrackAllocData *data)

{
  undefined4 *puVar1;
  code *pcVar2;
  type_info *ptVar3;
  size_t sVar4;
  char *pcVar5;
  undefined4 uVar6;
  bool bVar7;
  TrackAllocData *this_00;
  undefined8 *in_FS_OFFSET;
  
  if (this->trackerDictionary != (TypeInfotoTrackerItemMap *)0x0) {
    this_00 = &this->nextAllocData;
    bVar7 = TrackAllocData::IsEmpty(this_00);
    if (bVar7) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x1fbe,"(!nextAllocData.IsEmpty())",
                         "Missing tracking information for this allocation, are you not using the macros?"
                        );
      if (!bVar7) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar1 = 0;
    }
    if (data != (TrackAllocData *)0x0) {
      uVar6 = *(undefined4 *)&(this->nextAllocData).field_0x24;
      data->line = (this->nextAllocData).line;
      *(undefined4 *)&data->field_0x24 = uVar6;
      ptVar3 = this_00->typeinfo;
      sVar4 = (this->nextAllocData).plusSize;
      pcVar5 = (this->nextAllocData).filename;
      data->count = (this->nextAllocData).count;
      data->filename = pcVar5;
      data->typeinfo = ptVar3;
      data->plusSize = sVar4;
    }
    this_00->typeinfo = (type_info *)0x0;
    (this->nextAllocData).plusSize = 0;
    (this->nextAllocData).count = 0;
  }
  return;
}

Assistant:

void
Recycler::ClearTrackAllocInfo(TrackAllocData* data/* = NULL*/)
{
#ifdef PROFILE_RECYCLER_ALLOC
    if (this->trackerDictionary != nullptr)
    {
        AssertMsg(!nextAllocData.IsEmpty(), "Missing tracking information for this allocation, are you not using the macros?");
        if (data)
        {
            *data = nextAllocData;
        }
        nextAllocData.Clear();
    }
#endif
}